

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SWDTypes.cpp
# Opt level: O0

void __thiscall SWDOperation::AddFrames(SWDOperation *this,SWDAnalyzerResults *pResults)

{
  bool bVar1;
  size_type sVar2;
  reference pvVar3;
  reference this_00;
  pointer this_01;
  __normal_iterator<SWDBit_*,_std::vector<SWDBit,_std::allocator<SWDBit>_>_> local_148;
  SWDBit local_140;
  SWDBit local_118;
  SWDBit *local_f0;
  SWDBit local_e8;
  __normal_iterator<SWDBit_*,_std::vector<SWDBit,_std::allocator<SWDBit>_>_> local_c0;
  __normal_iterator<SWDBit_*,_std::vector<SWDBit,_std::allocator<SWDBit>_>_> local_b8;
  iterator bi;
  SWDBit local_a8;
  undefined1 local_70 [8];
  SWDRequestFrame req;
  Frame f;
  SWDAnalyzerResults *pResults_local;
  SWDOperation *this_local;
  
  Frame::Frame((Frame *)&req.field_0x20);
  sVar2 = std::vector<SWDBit,_std::allocator<SWDBit>_>::size(&this->bits);
  if (sVar2 < 0xc) {
    __assert_fail("bits.size() >= TRAN_REQ_AND_ACK",
                  "/workspace/llm4binary/github/license_c_cmakelists/saleae[P]swd-analyzer/src/SWDTypes.cpp"
                  ,0x47,"void SWDOperation::AddFrames(SWDAnalyzerResults *)");
  }
  SWDRequestFrame::SWDRequestFrame((SWDRequestFrame *)local_70);
  pvVar3 = std::vector<SWDBit,_std::allocator<SWDBit>_>::operator[](&this->bits,0);
  local_70 = (undefined1  [8])SWDBit::GetStartSample(pvVar3);
  pvVar3 = std::vector<SWDBit,_std::allocator<SWDBit>_>::operator[](&this->bits,7);
  req._0_8_ = SWDBit::GetEndSample(pvVar3);
  bVar1 = IsRead(this);
  req._25_1_ = bVar1 + (this->APnDP & 1U) * '\x02';
  SWDRequestFrame::SetRequestByte((SWDRequestFrame *)local_70,this->request_byte);
  SWDRequestFrame::SetRegister((SWDRequestFrame *)local_70,this->reg);
  req._24_1_ = 3;
  AnalyzerResults::AddFrame((Frame *)pResults);
  std::vector<SWDBit,_std::allocator<SWDBit>_>::operator[](&this->bits,8);
  SWDBit::MakeFrame(&local_a8);
  req._32_4_ = local_a8.state_rising;
  req._36_4_ = local_a8.state_falling;
  Frame::~Frame((Frame *)&local_a8);
  AnalyzerResults::AddFrame((Frame *)pResults);
  pvVar3 = std::vector<SWDBit,_std::allocator<SWDBit>_>::operator[](&this->bits,9);
  req._32_8_ = SWDBit::GetStartSample(pvVar3);
  pvVar3 = std::vector<SWDBit,_std::allocator<SWDBit>_>::operator[](&this->bits,0xb);
  SWDBit::GetEndSample(pvVar3);
  AnalyzerResults::AddFrame((Frame *)pResults);
  sVar2 = std::vector<SWDBit,_std::allocator<SWDBit>_>::size(&this->bits);
  if (sVar2 < 0x2d) {
    bi._M_current._4_4_ = 1;
  }
  else {
    local_c0._M_current = (SWDBit *)std::vector<SWDBit,_std::allocator<SWDBit>_>::begin(&this->bits)
    ;
    local_b8 = __gnu_cxx::__normal_iterator<SWDBit_*,_std::vector<SWDBit,_std::allocator<SWDBit>_>_>
               ::operator+(&local_c0,0xc);
    bVar1 = IsRead(this);
    if (!bVar1) {
      std::vector<SWDBit,_std::allocator<SWDBit>_>::operator[](&this->bits,0xc);
      SWDBit::MakeFrame(&local_e8);
      req._32_4_ = local_e8.state_rising;
      req._36_4_ = local_e8.state_falling;
      Frame::~Frame((Frame *)&local_e8);
      AnalyzerResults::AddFrame((Frame *)pResults);
      local_f0 = (SWDBit *)
                 __gnu_cxx::
                 __normal_iterator<SWDBit_*,_std::vector<SWDBit,_std::allocator<SWDBit>_>_>::
                 operator++(&local_b8,0);
    }
    __gnu_cxx::__normal_iterator<SWDBit_*,_std::vector<SWDBit,_std::allocator<SWDBit>_>_>::
    operator->(&local_b8);
    SWDBit::MakeFrame(&local_118);
    req._32_4_ = local_118.state_rising;
    req._36_4_ = local_118.state_falling;
    Frame::~Frame((Frame *)&local_118);
    this_00 = __gnu_cxx::__normal_iterator<SWDBit_*,_std::vector<SWDBit,_std::allocator<SWDBit>_>_>
              ::operator[](&local_b8,0x1f);
    SWDBit::GetEndSample(this_00);
    AnalyzerResults::AddFrame((Frame *)pResults);
    __gnu_cxx::__normal_iterator<SWDBit_*,_std::vector<SWDBit,_std::allocator<SWDBit>_>_>::
    operator[](&local_b8,0x20);
    SWDBit::MakeFrame(&local_140);
    req._32_4_ = local_140.state_rising;
    req._36_4_ = local_140.state_falling;
    Frame::~Frame((Frame *)&local_140);
    AnalyzerResults::AddFrame((Frame *)pResults);
    __gnu_cxx::__normal_iterator<SWDBit_*,_std::vector<SWDBit,_std::allocator<SWDBit>_>_>::
    operator+=(&local_b8,0x21);
    local_148._M_current = (SWDBit *)std::vector<SWDBit,_std::allocator<SWDBit>_>::end(&this->bits);
    bVar1 = __gnu_cxx::operator<(&local_b8,&local_148);
    if (bVar1) {
      this_01 = __gnu_cxx::
                __normal_iterator<SWDBit_*,_std::vector<SWDBit,_std::allocator<SWDBit>_>_>::
                operator->(&local_b8);
      req._32_8_ = SWDBit::GetStartSample(this_01);
      pvVar3 = std::vector<SWDBit,_std::allocator<SWDBit>_>::back(&this->bits);
      SWDBit::GetEndSample(pvVar3);
      AnalyzerResults::AddFrame((Frame *)pResults);
    }
    bi._M_current._4_4_ = 0;
  }
  SWDRequestFrame::~SWDRequestFrame((SWDRequestFrame *)local_70);
  Frame::~Frame((Frame *)&req.field_0x20);
  return;
}

Assistant:

void SWDOperation::AddFrames( SWDAnalyzerResults* pResults )
{
    Frame f;

    assert( bits.size() >= TRAN_REQ_AND_ACK );

    // request
    SWDRequestFrame req;
    req.mStartingSampleInclusive = bits[ 0 ].GetStartSample();
    req.mEndingSampleInclusive = bits[ 7 ].GetEndSample();
    req.mFlags = ( IsRead() ? SWDRequestFrame::IS_READ : 0 ) | ( APnDP ? SWDRequestFrame::IS_ACCESS_PORT : 0 );
    req.SetRequestByte( request_byte );
    req.SetRegister( reg );
    req.mType = SWDFT_Request;
    pResults->AddFrame( req );

    // turnaround
    f = bits[ 8 ].MakeFrame();
    f.mType = SWDFT_Turnaround;
    pResults->AddFrame( f );

    // ack
    f.mStartingSampleInclusive = bits[ 9 ].GetStartSample();
    f.mEndingSampleInclusive = bits[ 11 ].GetEndSample();
    f.mType = SWDFT_ACK;
    f.mData1 = ACK;
    pResults->AddFrame( f );

    if( bits.size() < TRAN_READ_LENGTH )
        return;

    // turnaround
    std::vector<SWDBit>::iterator bi( bits.begin() + 12 );
    if( !IsRead() )
    {
        f = bits[ 12 ].MakeFrame();
        f.mType = SWDFT_Turnaround;
        pResults->AddFrame( f );
        bi++;
    }

    // data
    f = bi->MakeFrame();
    f.mEndingSampleInclusive = bi[ 31 ].GetEndSample();
    f.mType = SWDFT_WData;
    f.mData1 = data;
    f.mData2 = reg;
    pResults->AddFrame( f );

    // data parity
    f = bi[ 32 ].MakeFrame();
    f.mType = SWDFT_DataParity;
    f.mData1 = data_parity;
    f.mData2 = data_parity_ok ? 1 : 0;
    pResults->AddFrame( f );

    bi += 33;

    // do we have trailing bits?
    if( bi < bits.end() )
    {
        f.mStartingSampleInclusive = bi->GetStartSample();
        f.mEndingSampleInclusive = bits.back().GetEndSample();
        f.mType = SWDFT_TrailingBits;

        f.mFlags = 0;
        f.mData1 = 0;
        f.mData2 = 0;

        pResults->AddFrame( f );
    }
}